

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O1

optional<dap::StoppedEvent> * __thiscall
cmDebugger::cmDebuggerExceptionManager::RaiseExceptionIfAny
          (optional<dap::StoppedEvent> *__return_storage_ptr__,cmDebuggerExceptionManager *this,
          MessageType t,string *text)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  unique_lock<std::mutex> lock;
  StoppedEvent stoppedEvent;
  MessageType local_134;
  unique_lock<std::mutex> local_130;
  undefined1 local_120 [32];
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [120];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  bool local_48;
  integer local_40;
  bool local_38;
  
  (__return_storage_ptr__->super__Optional_base<dap::StoppedEvent,_false,_false>)._M_payload.
  super__Optional_payload<dap::StoppedEvent,_true,_false,_false>.
  super__Optional_payload_base<dap::StoppedEvent>._M_engaged = false;
  local_130._M_device = &this->Mutex;
  local_130._M_owns = false;
  local_134 = t;
  std::unique_lock<std::mutex>::lock(&local_130);
  local_130._M_owns = true;
  pmVar2 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->ExceptionMap,&local_134);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->RaiseExceptions,&pmVar2->Filter);
  if (*pmVar3 == true) {
    local_e0._16_8_ = (char *)0x0;
    local_e0[0x18] = '\0';
    local_e0[0x28] = false;
    local_e0._48_8_ = (pointer)0x0;
    local_e0[0x38] = 0;
    local_e0._57_7_ = 0;
    local_e0[0x40] = 0;
    local_e0._65_7_ = 0;
    local_e0[0x48] = false;
    local_e0[0x50] = false;
    local_e0[0x51] = false;
    local_e0._88_8_ = local_e0 + 0x68;
    local_e0._96_8_ = 0;
    local_e0[0x68] = '\0';
    local_60 = 0;
    local_58._M_local_buf[0] = '\0';
    local_48 = false;
    local_40.val = 0;
    local_38 = false;
    local_e0[0] = true;
    local_e0[1] = true;
    local_e0._8_8_ = local_e0 + 0x18;
    local_68._M_p = (pointer)&local_58;
    std::__cxx11::string::_M_replace((ulong)(local_e0 + 0x58),0,(char *)0x0,0x8df8d7);
    std::__cxx11::string::_M_replace((ulong)(local_e0 + 8),0,(char *)local_e0._16_8_,0x8df8ce);
    local_e0[0x28] = true;
    std::__cxx11::string::_M_assign((string *)&local_68);
    local_48 = true;
    pmVar2 = std::__detail::
             _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->ExceptionMap,&local_134);
    local_120._0_8_ = local_120 + 0x10;
    pcVar1 = (pmVar2->Filter)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_120,pcVar1,pcVar1 + (pmVar2->Filter)._M_string_length);
    pcVar1 = (text->_M_dataplus)._M_p;
    local_100._M_p = (pointer)&local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar1,pcVar1 + text->_M_string_length);
    std::optional<cmDebugger::cmDebuggerException>::operator=
              (&this->TheException,(cmDebuggerException *)local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    std::optional<dap::StoppedEvent>::operator=(__return_storage_ptr__,(StoppedEvent *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,
                      CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_e0._88_8_ != local_e0 + 0x68) {
      operator_delete((void *)local_e0._88_8_,CONCAT71(local_e0._105_7_,local_e0[0x68]) + 1);
    }
    if ((pointer)local_e0._48_8_ != (pointer)0x0) {
      operator_delete((void *)local_e0._48_8_,
                      CONCAT71(local_e0._65_7_,local_e0[0x40]) - local_e0._48_8_);
    }
    if ((undefined1 *)local_e0._8_8_ != local_e0 + 0x18) {
      operator_delete((void *)local_e0._8_8_,CONCAT71(local_e0._25_7_,local_e0[0x18]) + 1);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_130);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<dap::StoppedEvent>
cmDebuggerExceptionManager::RaiseExceptionIfAny(MessageType t,
                                                std::string const& text)
{
  cm::optional<dap::StoppedEvent> maybeStoppedEvent;
  std::unique_lock<std::mutex> lock(Mutex);
  if (RaiseExceptions[ExceptionMap[t].Filter]) {
    dap::StoppedEvent stoppedEvent;
    stoppedEvent.allThreadsStopped = true;
    stoppedEvent.reason = "exception";
    stoppedEvent.description = "Pause on exception";
    stoppedEvent.text = text;
    TheException = cmDebuggerException{ ExceptionMap[t].Filter, text };
    maybeStoppedEvent = std::move(stoppedEvent);
  }

  return maybeStoppedEvent;
}